

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::logsumexp_dev<dynet::Device_CPU>
               (Device_CPU *dev,Tensor *x,Tensor *m,Tensor *z)

{
  uint uVar1;
  reference pvVar2;
  long in_RDX;
  Dim *in_RSI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  size_t i;
  size_t b;
  float *miter;
  array<int,_1> red_axis;
  float mval;
  DefaultDevice *in_stack_fffffffffffffa68;
  Tensor *in_stack_fffffffffffffa70;
  TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
  *this;
  TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
  *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  Scalar in_stack_fffffffffffffa84;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffa88;
  Tensor *in_stack_fffffffffffffa90;
  TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  local_488 [256];
  TensorDevice<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
  local_388;
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
  local_2a0 [168];
  TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
  *local_1f8;
  ulong local_1f0;
  long local_1e8;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_1c8;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_168;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_158;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_148;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_138 [56];
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_100;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_f0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_e0;
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  local_b8 [76];
  real local_6c;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_68;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_58;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_48;
  long local_18;
  Dim *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_RSI->bd == 1) && (uVar1 = Dim::operator[](in_RSI,1), uVar1 == 1)) {
    local_48 = Tensor::t<1>(in_stack_fffffffffffffa70);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::maximum<0>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
                  *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    local_68 = Tensor::t<0>((Tensor *)0xda5353);
    local_58 = Eigen::
               TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
               ::device<Eigen::DefaultDevice>
                         ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
                           *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)in_stack_fffffffffffffa78);
    local_6c = as_scalar((Tensor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    local_e0 = Tensor::t<1>(in_stack_fffffffffffffa70);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::operator-(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::exp(local_b8,__x);
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
    ::sum((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
           *)in_stack_fffffffffffffa78);
    local_100 = Tensor::t<0>((Tensor *)0xda5421);
    local_f0 = Eigen::
               TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
               ::device<Eigen::DefaultDevice>
                         ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
                           *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>
                 *)in_stack_fffffffffffffa78);
    local_148 = Tensor::t<0>((Tensor *)0xda5474);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::log(local_138,__x_00);
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::operator+((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
    local_168 = Tensor::t<0>((Tensor *)0xda54bc);
    local_158 = Eigen::
                TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
                ::device<Eigen::DefaultDevice>
                          ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
                            *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)in_stack_fffffffffffffa78);
  }
  else {
    pvVar2 = std::array<int,_1UL>::operator[]
                       ((array<int,_1UL> *)in_stack_fffffffffffffa70,
                        (size_type)in_stack_fffffffffffffa68);
    *pvVar2 = 0;
    Tensor::tb<2>(in_stack_fffffffffffffa90);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    maximum<std::array<int,1ul>,0>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (array<int,_1UL> *)in_stack_fffffffffffffa78);
    Tensor::tb<1>((Tensor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    local_1c8 = Eigen::
                TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                ::device<Eigen::DefaultDevice>
                          ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                            *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)in_stack_fffffffffffffa78);
    local_1e8 = *(long *)(local_18 + 0x28);
    for (local_1f0 = 0; local_1f0 < local_10->bd; local_1f0 = local_1f0 + 1) {
      local_1f8 = (TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
                   *)0x0;
      while (this = local_1f8, uVar1 = Dim::operator[](local_10,1),
            this < (TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
                    *)(ulong)uVar1) {
        Tensor::tb<2>(in_stack_fffffffffffffa90);
        Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>::
        chip<2l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<2l,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const>,1>
        ::chip<1l>((TensorBase<Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                    *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
        ::operator-((TensorBase<Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
                     *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        Eigen::
        TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
        ::exp(local_2a0,__x_01);
        Eigen::
        TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_0>
        ::sum((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_0>
               *)in_stack_fffffffffffffa78);
        Tensor::tb<1>((Tensor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
        chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,1>
        ::chip<0l>((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                    *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (Index)in_stack_fffffffffffffa78);
        local_388 = Eigen::
                    TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
                    ::device<Eigen::DefaultDevice>(this,in_stack_fffffffffffffa68);
        Eigen::
        TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
        ::operator=((TensorDevice<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
                     *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                    (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::MakePointer>
                     *)in_stack_fffffffffffffa78);
        Tensor::tb<1>((Tensor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
        chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,1>
        ::chip<0l>((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                    *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
        ::log(local_488,__x_02);
        Eigen::
        TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
        ::operator+((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
                     *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        Tensor::tb<1>((Tensor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
        chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,1>
        ::chip<0l>((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                    *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (Index)in_stack_fffffffffffffa78);
        Eigen::
        TensorBase<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
        ::device<Eigen::DefaultDevice>(this,in_stack_fffffffffffffa68);
        Eigen::
        TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
        ::operator=((TensorDevice<Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
                     *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                    in_stack_fffffffffffffa78);
        local_1f8 = local_1f8 + 1;
        local_1e8 = local_1e8 + 4;
      }
    }
  }
  return;
}

Assistant:

void TensorTools::logsumexp_dev(const MyDevice & dev, const Tensor& x, Tensor & m, Tensor& z) {
  if(x.d.bd == 1 && x.d[1] == 1) {
    m.t<0>().device(*dev.edevice) = x.t<1>().maximum();
#ifdef __CUDACC__
    Eigen::array<int, 1> bcast;
    bcast[0] = x.d[0];
    // This needs to be split into two lines to prevent memory allocation
    // TODO? Here and in logsoftmax: Is there a better way to subtract a scalar that is already on the GPU without using broadcasting (and without copying the scalar back to the host first)
    z.t<0>().device(*dev.edevice) = (x.t<1>() - m.t<1>().broadcast(bcast)).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + m.t<0>();
#else
    float mval = as_scalar(m);
    // This needs to be split into two lines to prevent memory allocation
    z.t<0>().device(*dev.edevice) = (x.t<1>() - mval).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + mval;
#endif
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    m.tb<1>().device(*dev.edevice) = x.tb<2>().maximum(red_axis);
    // TODO: Currently, the first version is slower on CPU, hence the switch
#ifdef __CUDACC__
    Eigen::array<int, 3> bcast({(int)x.d.rows(), 1, 1});
    Eigen::array<int, 3> morph({1, (int)m.d[0], (int)m.d.bd});
    // This needs to be split into two lines to prevent memory allocation
    z.tb<1>().device(*dev.edevice) = (x.tb<2>() - m.tb<2>().reshape(morph).broadcast(bcast)).exp().sum(red_axis);
    z.tb<1>().device(*dev.edevice) = z.tb<1>().log() + m.tb<1>();
#else
    auto miter = m.v;
    for(size_t b = 0; b < x.d.bd; ++b) {
      for(size_t i = 0; i < x.d[1]; ++i, ++miter) {
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = (x.tb<2>().chip<2>(b).chip<1>(i) - *miter).exp().sum();
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = z.tb<1>().chip<1>(b).chip<0>(i).log() + *miter;
      }
    }
#endif
  }
}